

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx::
     BVHNIntersector1<4,_16777232,_false,_embree::avx::ArrayIntersector1<embree::avx::TriangleMiMBIntersector1Moeller<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  undefined8 *puVar2;
  float *pfVar3;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar4;
  Geometry *pGVar5;
  long lVar6;
  RTCIntersectArguments *pRVar7;
  RTCRayQueryContext *pRVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 (*pauVar26) [16];
  int iVar27;
  AABBNodeMB4D *node1;
  ulong uVar28;
  long lVar29;
  long lVar30;
  ulong uVar31;
  float *vertices;
  ulong uVar32;
  long lVar33;
  ulong uVar34;
  ulong uVar35;
  undefined4 uVar36;
  ulong uVar37;
  ulong uVar38;
  ulong uVar39;
  ulong uVar40;
  ulong uVar41;
  int *piVar42;
  ulong uVar43;
  ulong uVar44;
  ulong uVar45;
  float fVar46;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  float fVar57;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  float fVar55;
  float fVar56;
  undefined1 auVar54 [64];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  float fVar68;
  float fVar81;
  float fVar82;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  float fVar83;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  float fVar97;
  float fVar101;
  float fVar102;
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  float fVar103;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  float fVar106;
  undefined1 auVar107 [64];
  float fVar108;
  float fVar110;
  float fVar111;
  float fVar112;
  undefined1 auVar109 [64];
  float fVar113;
  uint uVar114;
  undefined1 auVar115 [16];
  float fVar117;
  uint uVar118;
  float fVar119;
  uint uVar120;
  float fVar121;
  uint uVar122;
  undefined1 auVar116 [64];
  undefined1 auVar123 [16];
  undefined1 auVar124 [64];
  undefined1 auVar125 [16];
  undefined1 auVar126 [64];
  undefined1 auVar127 [16];
  undefined1 auVar128 [64];
  float fVar134;
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  float fVar132;
  float fVar133;
  undefined1 auVar131 [64];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  vbool<4> valid;
  Scene *scene;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  int local_120c;
  undefined1 local_1208 [8];
  undefined8 uStack_1200;
  undefined1 local_11f8 [8];
  float fStack_11f0;
  float fStack_11ec;
  undefined1 local_11e8 [8];
  float fStack_11e0;
  float fStack_11dc;
  undefined1 local_11d8 [16];
  Scene *local_11c0;
  RTCFilterFunctionNArguments local_11b8;
  undefined1 local_1188 [8];
  float fStack_1180;
  float fStack_117c;
  undefined1 local_1178 [8];
  float fStack_1170;
  float fStack_116c;
  ulong local_1168;
  ulong local_1160;
  ulong local_1158;
  ulong local_1150;
  ulong local_1148;
  undefined1 (*local_1140) [16];
  long local_1138;
  long local_1130;
  float local_1128;
  undefined4 local_1124;
  undefined4 local_1120;
  float local_111c;
  float local_1118;
  undefined4 local_1114;
  uint local_1110;
  uint local_110c;
  uint local_1108;
  undefined8 local_10f8;
  undefined8 uStack_10f0;
  undefined8 local_10e8;
  undefined8 uStack_10e0;
  undefined1 local_10d8 [16];
  undefined1 local_10c8 [16];
  undefined1 local_10b8 [16];
  undefined1 local_10a8 [16];
  undefined1 local_1088 [16];
  float local_1078 [4];
  float local_1068 [4];
  undefined1 local_1058 [16];
  undefined1 local_1048 [16];
  undefined1 local_1038 [16];
  undefined8 local_1028;
  undefined8 uStack_1020;
  undefined1 local_1018 [16];
  undefined1 local_1008 [16];
  undefined1 local_ff8 [16];
  undefined1 local_fe8 [16];
  undefined1 local_fd8 [16];
  undefined1 local_fc8 [16];
  undefined1 local_fb8 [16];
  undefined1 local_fa8 [8];
  float fStack_fa0;
  float fStack_f9c;
  undefined1 local_f98 [8];
  float fStack_f90;
  float fStack_f8c;
  undefined8 local_f88;
  undefined8 uStack_f80;
  long local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    local_f78 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
    uStack_f70 = 0;
    if (local_f78 != 8) {
      local_1140 = (undefined1 (*) [16])local_f68;
      auVar71 = vmaxss_avx(ZEXT816(0) << 0x40,
                           ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]));
      auVar58 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).tfar));
      aVar4 = (ray->super_RayK<1>).dir.field_0;
      auVar59._8_4_ = 0x7fffffff;
      auVar59._0_8_ = 0x7fffffff7fffffff;
      auVar59._12_4_ = 0x7fffffff;
      auVar59 = vandps_avx((undefined1  [16])aVar4,auVar59);
      auVar90._8_4_ = 0x219392ef;
      auVar90._0_8_ = 0x219392ef219392ef;
      auVar90._12_4_ = 0x219392ef;
      auVar59 = vcmpps_avx(auVar59,auVar90,1);
      auVar59 = vblendvps_avx((undefined1  [16])aVar4,auVar90,auVar59);
      auVar90 = vrcpps_avx(auVar59);
      fVar46 = auVar90._0_4_;
      auVar69._0_4_ = auVar59._0_4_ * fVar46;
      fVar55 = auVar90._4_4_;
      auVar69._4_4_ = auVar59._4_4_ * fVar55;
      fVar56 = auVar90._8_4_;
      auVar69._8_4_ = auVar59._8_4_ * fVar56;
      fVar57 = auVar90._12_4_;
      auVar69._12_4_ = auVar59._12_4_ * fVar57;
      auVar91._8_4_ = 0x3f800000;
      auVar91._0_8_ = &DAT_3f8000003f800000;
      auVar91._12_4_ = 0x3f800000;
      auVar59 = vsubps_avx(auVar91,auVar69);
      auVar70._0_4_ = fVar46 + fVar46 * auVar59._0_4_;
      auVar70._4_4_ = fVar55 + fVar55 * auVar59._4_4_;
      auVar70._8_4_ = fVar56 + fVar56 * auVar59._8_4_;
      auVar70._12_4_ = fVar57 + fVar57 * auVar59._12_4_;
      uVar36 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
      local_fb8._4_4_ = uVar36;
      local_fb8._0_4_ = uVar36;
      local_fb8._8_4_ = uVar36;
      local_fb8._12_4_ = uVar36;
      auVar107 = ZEXT1664(local_fb8);
      uVar36 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
      local_fc8._4_4_ = uVar36;
      local_fc8._0_4_ = uVar36;
      local_fc8._8_4_ = uVar36;
      local_fc8._12_4_ = uVar36;
      auVar109 = ZEXT1664(local_fc8);
      uVar36 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
      local_fd8._4_4_ = uVar36;
      local_fd8._0_4_ = uVar36;
      local_fd8._8_4_ = uVar36;
      local_fd8._12_4_ = uVar36;
      auVar116 = ZEXT1664(local_fd8);
      local_fe8 = vshufps_avx(auVar70,auVar70,0);
      auVar124 = ZEXT1664(local_fe8);
      auVar59 = vmovshdup_avx(auVar70);
      local_ff8 = vshufps_avx(auVar70,auVar70,0x55);
      auVar126 = ZEXT1664(local_ff8);
      auVar90 = vshufpd_avx(auVar70,auVar70,1);
      local_1148 = (ulong)(auVar70._0_4_ < 0.0) << 4;
      local_1008 = vshufps_avx(auVar70,auVar70,0xaa);
      auVar128 = ZEXT1664(local_1008);
      local_1150 = (ulong)(auVar59._0_4_ < 0.0) << 4 | 0x20;
      uVar45 = (ulong)(auVar90._0_4_ < 0.0) << 4 | 0x40;
      local_1018 = vshufps_avx(auVar71,auVar71,0);
      auVar131 = ZEXT1664(local_1018);
      auVar59 = vshufps_avx(auVar58,auVar58,0);
      auVar54 = ZEXT1664(auVar59);
      local_10f8 = mm_lookupmask_ps._240_8_;
      uStack_10f0 = mm_lookupmask_ps._248_8_;
      local_1158 = uVar45;
      local_1160 = local_1148 ^ 0x10;
      local_1168 = local_1150 ^ 0x10;
      uVar31 = local_1148;
      uVar34 = local_1148 ^ 0x10;
      uVar35 = local_1150 ^ 0x10;
      uVar37 = local_1150;
      uVar39 = uVar45;
      do {
        do {
          do {
            if (local_1140 == (undefined1 (*) [16])&local_f78) {
              return;
            }
            pauVar26 = local_1140 + -1;
            local_1140 = local_1140 + -1;
          } while ((ray->super_RayK<1>).tfar < *(float *)(*pauVar26 + 8));
          uVar32 = *(ulong *)*local_1140;
          do {
            if ((uVar32 & 8) == 0) {
              uVar28 = uVar32 & 0xfffffffffffffff0;
              fVar46 = (ray->super_RayK<1>).dir.field_0.m128[3];
              auVar58._4_4_ = fVar46;
              auVar58._0_4_ = fVar46;
              auVar58._8_4_ = fVar46;
              auVar58._12_4_ = fVar46;
              pfVar3 = (float *)(uVar28 + 0x80 + uVar31);
              pfVar1 = (float *)(uVar28 + 0x20 + uVar31);
              auVar71._0_4_ = fVar46 * *pfVar3 + *pfVar1;
              auVar71._4_4_ = fVar46 * pfVar3[1] + pfVar1[1];
              auVar71._8_4_ = fVar46 * pfVar3[2] + pfVar1[2];
              auVar71._12_4_ = fVar46 * pfVar3[3] + pfVar1[3];
              auVar59 = vsubps_avx(auVar71,auVar107._0_16_);
              auVar72._0_4_ = auVar124._0_4_ * auVar59._0_4_;
              auVar72._4_4_ = auVar124._4_4_ * auVar59._4_4_;
              auVar72._8_4_ = auVar124._8_4_ * auVar59._8_4_;
              auVar72._12_4_ = auVar124._12_4_ * auVar59._12_4_;
              auVar59 = vmaxps_avx(auVar131._0_16_,auVar72);
              pfVar3 = (float *)(uVar28 + 0x80 + uVar37);
              pfVar1 = (float *)(uVar28 + 0x20 + uVar37);
              auVar84._0_4_ = fVar46 * *pfVar3 + *pfVar1;
              auVar84._4_4_ = fVar46 * pfVar3[1] + pfVar1[1];
              auVar84._8_4_ = fVar46 * pfVar3[2] + pfVar1[2];
              auVar84._12_4_ = fVar46 * pfVar3[3] + pfVar1[3];
              auVar71 = vsubps_avx(auVar84,auVar109._0_16_);
              auVar85._0_4_ = auVar126._0_4_ * auVar71._0_4_;
              auVar85._4_4_ = auVar126._4_4_ * auVar71._4_4_;
              auVar85._8_4_ = auVar126._8_4_ * auVar71._8_4_;
              auVar85._12_4_ = auVar126._12_4_ * auVar71._12_4_;
              pfVar3 = (float *)(uVar28 + 0x80 + uVar39);
              pfVar1 = (float *)(uVar28 + 0x20 + uVar39);
              auVar92._0_4_ = fVar46 * *pfVar3 + *pfVar1;
              auVar92._4_4_ = fVar46 * pfVar3[1] + pfVar1[1];
              auVar92._8_4_ = fVar46 * pfVar3[2] + pfVar1[2];
              auVar92._12_4_ = fVar46 * pfVar3[3] + pfVar1[3];
              auVar71 = vsubps_avx(auVar92,auVar116._0_16_);
              auVar93._0_4_ = auVar128._0_4_ * auVar71._0_4_;
              auVar93._4_4_ = auVar128._4_4_ * auVar71._4_4_;
              auVar93._8_4_ = auVar128._8_4_ * auVar71._8_4_;
              auVar93._12_4_ = auVar128._12_4_ * auVar71._12_4_;
              auVar71 = vmaxps_avx(auVar85,auVar93);
              local_10d8 = vmaxps_avx(auVar59,auVar71);
              pfVar3 = (float *)(uVar28 + 0x80 + uVar34);
              pfVar1 = (float *)(uVar28 + 0x20 + uVar34);
              auVar86._0_4_ = fVar46 * *pfVar3 + *pfVar1;
              auVar86._4_4_ = fVar46 * pfVar3[1] + pfVar1[1];
              auVar86._8_4_ = fVar46 * pfVar3[2] + pfVar1[2];
              auVar86._12_4_ = fVar46 * pfVar3[3] + pfVar1[3];
              auVar59 = vsubps_avx(auVar86,auVar107._0_16_);
              auVar87._0_4_ = auVar124._0_4_ * auVar59._0_4_;
              auVar87._4_4_ = auVar124._4_4_ * auVar59._4_4_;
              auVar87._8_4_ = auVar124._8_4_ * auVar59._8_4_;
              auVar87._12_4_ = auVar124._12_4_ * auVar59._12_4_;
              pfVar3 = (float *)(uVar28 + 0x80 + uVar35);
              pfVar1 = (float *)(uVar28 + 0x20 + uVar35);
              auVar94._0_4_ = fVar46 * *pfVar3 + *pfVar1;
              auVar94._4_4_ = fVar46 * pfVar3[1] + pfVar1[1];
              auVar94._8_4_ = fVar46 * pfVar3[2] + pfVar1[2];
              auVar94._12_4_ = fVar46 * pfVar3[3] + pfVar1[3];
              auVar59 = vsubps_avx(auVar94,auVar109._0_16_);
              auVar95._0_4_ = auVar126._0_4_ * auVar59._0_4_;
              auVar95._4_4_ = auVar126._4_4_ * auVar59._4_4_;
              auVar95._8_4_ = auVar126._8_4_ * auVar59._8_4_;
              auVar95._12_4_ = auVar126._12_4_ * auVar59._12_4_;
              pfVar3 = (float *)(uVar28 + 0x80 + (uVar45 ^ 0x10));
              pfVar1 = (float *)(uVar28 + 0x20 + (uVar45 ^ 0x10));
              auVar98._0_4_ = fVar46 * *pfVar3 + *pfVar1;
              auVar98._4_4_ = fVar46 * pfVar3[1] + pfVar1[1];
              auVar98._8_4_ = fVar46 * pfVar3[2] + pfVar1[2];
              auVar98._12_4_ = fVar46 * pfVar3[3] + pfVar1[3];
              auVar59 = vsubps_avx(auVar98,auVar116._0_16_);
              auVar99._0_4_ = auVar128._0_4_ * auVar59._0_4_;
              auVar99._4_4_ = auVar128._4_4_ * auVar59._4_4_;
              auVar99._8_4_ = auVar128._8_4_ * auVar59._8_4_;
              auVar99._12_4_ = auVar128._12_4_ * auVar59._12_4_;
              auVar59 = vminps_avx(auVar95,auVar99);
              auVar71 = vminps_avx(auVar54._0_16_,auVar87);
              auVar59 = vminps_avx(auVar71,auVar59);
              if (((uint)uVar32 & 7) == 6) {
                auVar71 = vcmpps_avx(local_10d8,auVar59,2);
                auVar59 = vcmpps_avx(*(undefined1 (*) [16])(uVar28 + 0xe0),auVar58,2);
                auVar58 = vcmpps_avx(auVar58,*(undefined1 (*) [16])(uVar28 + 0xf0),1);
                auVar59 = vandps_avx(auVar59,auVar58);
                auVar59 = vandps_avx(auVar59,auVar71);
              }
              else {
                auVar59 = vcmpps_avx(local_10d8,auVar59,2);
              }
              auVar59 = vpslld_avx(auVar59,0x1f);
              uVar36 = vmovmskps_avx(auVar59);
              This = (Intersectors *)CONCAT44((int)((ulong)This >> 0x20),uVar36);
            }
            if ((uVar32 & 8) == 0) {
              if (This == (Intersectors *)0x0) {
                iVar27 = 4;
              }
              else {
                uVar28 = uVar32 & 0xfffffffffffffff0;
                lVar30 = 0;
                if (This != (Intersectors *)0x0) {
                  for (; ((ulong)This >> lVar30 & 1) == 0; lVar30 = lVar30 + 1) {
                  }
                }
                iVar27 = 0;
                uVar32 = *(ulong *)(uVar28 + lVar30 * 8);
                uVar38 = (ulong)((long)&This[-1].intersector16_nofilter.name + 7U) & (ulong)This;
                if (uVar38 != 0) {
                  uVar114 = *(uint *)(local_10d8 + lVar30 * 4);
                  lVar30 = 0;
                  if (uVar38 != 0) {
                    for (; (uVar38 >> lVar30 & 1) == 0; lVar30 = lVar30 + 1) {
                    }
                  }
                  uVar40 = *(ulong *)(uVar28 + lVar30 * 8);
                  uVar118 = *(uint *)(local_10d8 + lVar30 * 4);
                  uVar38 = uVar38 - 1 & uVar38;
                  if (uVar38 == 0) {
                    if (uVar114 < uVar118) {
                      *(ulong *)*local_1140 = uVar40;
                      *(uint *)(*local_1140 + 8) = uVar118;
                      local_1140 = local_1140 + 1;
                    }
                    else {
                      *(ulong *)*local_1140 = uVar32;
                      *(uint *)(*local_1140 + 8) = uVar114;
                      uVar32 = uVar40;
                      local_1140 = local_1140 + 1;
                    }
                  }
                  else {
                    auVar60._8_8_ = 0;
                    auVar60._0_8_ = uVar32;
                    auVar59 = vpunpcklqdq_avx(auVar60,ZEXT416(uVar114));
                    auVar73._8_8_ = 0;
                    auVar73._0_8_ = uVar40;
                    auVar71 = vpunpcklqdq_avx(auVar73,ZEXT416(uVar118));
                    lVar30 = 0;
                    if (uVar38 != 0) {
                      for (; (uVar38 >> lVar30 & 1) == 0; lVar30 = lVar30 + 1) {
                      }
                    }
                    auVar88._8_8_ = 0;
                    auVar88._0_8_ = *(ulong *)(uVar28 + lVar30 * 8);
                    auVar90 = vpunpcklqdq_avx(auVar88,ZEXT416(*(uint *)(local_10d8 + lVar30 * 4)));
                    auVar58 = vpcmpgtd_avx(auVar71,auVar59);
                    uVar38 = uVar38 - 1 & uVar38;
                    if (uVar38 == 0) {
                      auVar69 = vpshufd_avx(auVar58,0xaa);
                      auVar58 = vblendvps_avx(auVar71,auVar59,auVar69);
                      auVar59 = vblendvps_avx(auVar59,auVar71,auVar69);
                      auVar71 = vpcmpgtd_avx(auVar90,auVar58);
                      auVar69 = vpshufd_avx(auVar71,0xaa);
                      auVar71 = vblendvps_avx(auVar90,auVar58,auVar69);
                      auVar58 = vblendvps_avx(auVar58,auVar90,auVar69);
                      auVar90 = vpcmpgtd_avx(auVar58,auVar59);
                      auVar69 = vpshufd_avx(auVar90,0xaa);
                      auVar90 = vblendvps_avx(auVar58,auVar59,auVar69);
                      auVar59 = vblendvps_avx(auVar59,auVar58,auVar69);
                      *local_1140 = auVar59;
                      local_1140[1] = auVar90;
                      uVar32 = auVar71._0_8_;
                      local_1140 = local_1140 + 2;
                    }
                    else {
                      lVar30 = 0;
                      if (uVar38 != 0) {
                        for (; (uVar38 >> lVar30 & 1) == 0; lVar30 = lVar30 + 1) {
                        }
                      }
                      auVar100._8_8_ = 0;
                      auVar100._0_8_ = *(ulong *)(uVar28 + lVar30 * 8);
                      auVar70 = vpunpcklqdq_avx(auVar100,ZEXT416(*(uint *)(local_10d8 + lVar30 * 4))
                                               );
                      auVar69 = vpshufd_avx(auVar58,0xaa);
                      auVar58 = vblendvps_avx(auVar71,auVar59,auVar69);
                      auVar59 = vblendvps_avx(auVar59,auVar71,auVar69);
                      auVar71 = vpcmpgtd_avx(auVar70,auVar90);
                      auVar69 = vpshufd_avx(auVar71,0xaa);
                      auVar71 = vblendvps_avx(auVar70,auVar90,auVar69);
                      auVar90 = vblendvps_avx(auVar90,auVar70,auVar69);
                      auVar69 = vpcmpgtd_avx(auVar90,auVar59);
                      auVar70 = vpshufd_avx(auVar69,0xaa);
                      auVar69 = vblendvps_avx(auVar90,auVar59,auVar70);
                      auVar59 = vblendvps_avx(auVar59,auVar90,auVar70);
                      auVar90 = vpcmpgtd_avx(auVar71,auVar58);
                      auVar70 = vpshufd_avx(auVar90,0xaa);
                      auVar90 = vblendvps_avx(auVar71,auVar58,auVar70);
                      auVar71 = vblendvps_avx(auVar58,auVar71,auVar70);
                      auVar58 = vpcmpgtd_avx(auVar69,auVar71);
                      auVar70 = vpshufd_avx(auVar58,0xaa);
                      auVar58 = vblendvps_avx(auVar69,auVar71,auVar70);
                      auVar71 = vblendvps_avx(auVar71,auVar69,auVar70);
                      *local_1140 = auVar59;
                      local_1140[1] = auVar71;
                      local_1140[2] = auVar58;
                      uVar32 = auVar90._0_8_;
                      local_1140 = local_1140 + 3;
                    }
                  }
                }
              }
            }
            else {
              iVar27 = 6;
            }
          } while (iVar27 == 0);
        } while (iVar27 != 6);
        local_1138 = (ulong)((uint)uVar32 & 0xf) - 8;
        if (local_1138 != 0) {
          uVar32 = uVar32 & 0xfffffffffffffff0;
          local_11c0 = context->scene;
          lVar30 = 0;
          do {
            local_1130 = lVar30;
            lVar29 = lVar30 * 0x50;
            pGVar5 = (local_11c0->geometries).items[*(uint *)(uVar32 + 0x30 + lVar29)].ptr;
            fVar46 = (pGVar5->time_range).lower;
            fVar46 = pGVar5->fnumTimeSegments *
                     (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar46) /
                     ((pGVar5->time_range).upper - fVar46));
            auVar59 = vroundss_avx(ZEXT416((uint)fVar46),ZEXT416((uint)fVar46),9);
            auVar59 = vminss_avx(auVar59,ZEXT416((uint)(pGVar5->fnumTimeSegments + -1.0)));
            auVar92 = vmaxss_avx(ZEXT816(0),auVar59);
            lVar33 = (long)(int)auVar92._0_4_ * 0x38;
            uVar31 = (ulong)*(uint *)(uVar32 + 4 + lVar29);
            lVar6 = *(long *)(*(long *)&pGVar5[2].numPrimitives + lVar33);
            lVar33 = *(long *)(*(long *)&pGVar5[2].numPrimitives + 0x38 + lVar33);
            auVar59 = *(undefined1 (*) [16])(lVar6 + (ulong)*(uint *)(uVar32 + lVar29) * 4);
            uVar43 = (ulong)*(uint *)(uVar32 + 0x10 + lVar29);
            auVar71 = *(undefined1 (*) [16])(lVar6 + uVar43 * 4);
            uVar34 = (ulong)*(uint *)(uVar32 + 0x20 + lVar29);
            auVar94 = *(undefined1 (*) [16])(lVar6 + uVar34 * 4);
            auVar58 = *(undefined1 (*) [16])(lVar6 + uVar31 * 4);
            uVar37 = (ulong)*(uint *)(uVar32 + 0x14 + lVar29);
            auVar90 = *(undefined1 (*) [16])(lVar6 + uVar37 * 4);
            uVar35 = (ulong)*(uint *)(uVar32 + 0x24 + lVar29);
            auVar95 = *(undefined1 (*) [16])(lVar6 + uVar35 * 4);
            uVar41 = (ulong)*(uint *)(uVar32 + 8 + lVar29);
            auVar69 = *(undefined1 (*) [16])(lVar6 + uVar41 * 4);
            uVar38 = (ulong)*(uint *)(uVar32 + 0x18 + lVar29);
            auVar70 = *(undefined1 (*) [16])(lVar6 + uVar38 * 4);
            uVar39 = (ulong)*(uint *)(uVar32 + 0x28 + lVar29);
            auVar91 = *(undefined1 (*) [16])(lVar6 + uVar39 * 4);
            uVar44 = (ulong)*(uint *)(uVar32 + 0xc + lVar29);
            auVar72 = *(undefined1 (*) [16])(lVar6 + uVar44 * 4);
            uVar40 = (ulong)*(uint *)(uVar32 + 0x1c + lVar29);
            auVar84 = *(undefined1 (*) [16])(lVar6 + uVar40 * 4);
            uVar28 = (ulong)*(uint *)(uVar32 + 0x2c + lVar29);
            auVar85 = *(undefined1 (*) [16])(lVar6 + uVar28 * 4);
            auVar86 = *(undefined1 (*) [16])(lVar33 + (ulong)*(uint *)(uVar32 + lVar29) * 4);
            auVar87 = *(undefined1 (*) [16])(lVar33 + uVar43 * 4);
            fVar46 = fVar46 - auVar92._0_4_;
            auVar92 = vunpcklps_avx(auVar59,auVar69);
            auVar69 = vunpckhps_avx(auVar59,auVar69);
            auVar93 = vunpcklps_avx(auVar58,auVar72);
            auVar58 = vunpckhps_avx(auVar58,auVar72);
            auVar59 = *(undefined1 (*) [16])(lVar33 + uVar31 * 4);
            _local_f98 = vunpcklps_avx(auVar69,auVar58);
            auVar100 = _local_f98;
            auVar72 = vunpcklps_avx(auVar92,auVar93);
            auVar69 = vunpckhps_avx(auVar92,auVar93);
            auVar92 = vunpcklps_avx(auVar71,auVar70);
            auVar58 = vunpckhps_avx(auVar71,auVar70);
            auVar70 = vunpcklps_avx(auVar90,auVar84);
            auVar90 = vunpckhps_avx(auVar90,auVar84);
            auVar71 = *(undefined1 (*) [16])(lVar33 + uVar41 * 4);
            auVar84 = vunpcklps_avx(auVar58,auVar90);
            auVar93 = vunpcklps_avx(auVar92,auVar70);
            _local_fa8 = vunpckhps_avx(auVar92,auVar70);
            auVar88 = _local_fa8;
            auVar92 = vunpcklps_avx(auVar94,auVar91);
            auVar90 = vunpckhps_avx(auVar94,auVar91);
            auVar91 = vunpcklps_avx(auVar95,auVar85);
            auVar70 = vunpckhps_avx(auVar95,auVar85);
            auVar58 = *(undefined1 (*) [16])(lVar33 + uVar44 * 4);
            auVar85 = vunpcklps_avx(auVar90,auVar70);
            auVar94 = vunpcklps_avx(auVar92,auVar91);
            auVar90 = vunpckhps_avx(auVar92,auVar91);
            auVar70 = vunpcklps_avx(auVar86,auVar71);
            auVar71 = vunpckhps_avx(auVar86,auVar71);
            auVar91 = vunpcklps_avx(auVar59,auVar58);
            auVar58 = vunpckhps_avx(auVar59,auVar58);
            auVar59 = *(undefined1 (*) [16])(lVar33 + uVar38 * 4);
            auVar86 = vunpcklps_avx(auVar71,auVar58);
            auVar92 = vunpcklps_avx(auVar70,auVar91);
            auVar58 = vunpckhps_avx(auVar70,auVar91);
            auVar91 = vunpcklps_avx(auVar87,auVar59);
            auVar70 = vunpckhps_avx(auVar87,auVar59);
            auVar59 = *(undefined1 (*) [16])(lVar33 + uVar37 * 4);
            auVar71 = *(undefined1 (*) [16])(lVar33 + uVar40 * 4);
            auVar87 = vunpcklps_avx(auVar59,auVar71);
            auVar59 = vunpckhps_avx(auVar59,auVar71);
            auVar95 = vunpcklps_avx(auVar70,auVar59);
            auVar98 = vunpcklps_avx(auVar91,auVar87);
            auVar70 = vunpckhps_avx(auVar91,auVar87);
            auVar59 = *(undefined1 (*) [16])(lVar33 + uVar34 * 4);
            auVar71 = *(undefined1 (*) [16])(lVar33 + uVar39 * 4);
            auVar87 = vunpcklps_avx(auVar59,auVar71);
            auVar91 = vunpckhps_avx(auVar59,auVar71);
            auVar59 = *(undefined1 (*) [16])(lVar33 + uVar35 * 4);
            auVar71 = *(undefined1 (*) [16])(lVar33 + uVar28 * 4);
            auVar99 = vunpcklps_avx(auVar59,auVar71);
            auVar59 = vunpckhps_avx(auVar59,auVar71);
            auVar60 = vunpcklps_avx(auVar91,auVar59);
            auVar73 = vunpcklps_avx(auVar87,auVar99);
            auVar91 = vunpckhps_avx(auVar87,auVar99);
            auVar59 = vshufps_avx(ZEXT416((uint)fVar46),ZEXT416((uint)fVar46),0);
            auVar71 = vshufps_avx(ZEXT416((uint)(1.0 - fVar46)),ZEXT416((uint)(1.0 - fVar46)),0);
            fVar46 = auVar59._0_4_;
            fVar55 = auVar59._4_4_;
            fVar56 = auVar59._8_4_;
            fVar57 = auVar59._12_4_;
            fVar106 = auVar71._0_4_;
            fVar132 = auVar71._4_4_;
            fVar133 = auVar71._8_4_;
            fVar134 = auVar71._12_4_;
            auVar127._0_4_ = fVar106 * auVar72._0_4_ + fVar46 * auVar92._0_4_;
            auVar127._4_4_ = fVar132 * auVar72._4_4_ + fVar55 * auVar92._4_4_;
            auVar127._8_4_ = fVar133 * auVar72._8_4_ + fVar56 * auVar92._8_4_;
            auVar127._12_4_ = fVar134 * auVar72._12_4_ + fVar57 * auVar92._12_4_;
            local_1188._0_4_ = auVar69._0_4_;
            local_1188._4_4_ = auVar69._4_4_;
            fStack_1180 = auVar69._8_4_;
            fStack_117c = auVar69._12_4_;
            local_1188._0_4_ = fVar106 * (float)local_1188._0_4_ + fVar46 * auVar58._0_4_;
            local_1188._4_4_ = fVar132 * (float)local_1188._4_4_ + fVar55 * auVar58._4_4_;
            fStack_1180 = fVar133 * fStack_1180 + fVar56 * auVar58._8_4_;
            fStack_117c = fVar134 * fStack_117c + fVar57 * auVar58._12_4_;
            auVar104._0_4_ = fVar106 * (float)local_f98._0_4_ + fVar46 * auVar86._0_4_;
            auVar104._4_4_ = fVar132 * (float)local_f98._4_4_ + fVar55 * auVar86._4_4_;
            auVar104._8_4_ = fVar133 * fStack_f90 + fVar56 * auVar86._8_4_;
            auVar104._12_4_ = fVar134 * fStack_f8c + fVar57 * auVar86._12_4_;
            auVar61._0_4_ = fVar106 * auVar93._0_4_ + fVar46 * auVar98._0_4_;
            auVar61._4_4_ = fVar132 * auVar93._4_4_ + fVar55 * auVar98._4_4_;
            auVar61._8_4_ = fVar133 * auVar93._8_4_ + fVar56 * auVar98._8_4_;
            auVar61._12_4_ = fVar134 * auVar93._12_4_ + fVar57 * auVar98._12_4_;
            auVar74._0_4_ = fVar106 * (float)local_fa8._0_4_ + fVar46 * auVar70._0_4_;
            auVar74._4_4_ = fVar132 * (float)local_fa8._4_4_ + fVar55 * auVar70._4_4_;
            auVar74._8_4_ = fVar133 * fStack_fa0 + fVar56 * auVar70._8_4_;
            auVar74._12_4_ = fVar134 * fStack_f9c + fVar57 * auVar70._12_4_;
            puVar2 = (undefined8 *)(uVar32 + 0x30 + lVar29);
            local_f88 = *puVar2;
            uStack_f80 = puVar2[1];
            puVar2 = (undefined8 *)(uVar32 + 0x40 + lVar29);
            local_1208._0_4_ = auVar84._0_4_;
            local_1208._4_4_ = auVar84._4_4_;
            uStack_1200._0_4_ = auVar84._8_4_;
            uStack_1200._4_4_ = auVar84._12_4_;
            auVar115._0_4_ = fVar106 * (float)local_1208._0_4_ + auVar95._0_4_ * fVar46;
            auVar115._4_4_ = fVar132 * (float)local_1208._4_4_ + auVar95._4_4_ * fVar55;
            auVar115._8_4_ = fVar133 * (float)uStack_1200 + auVar95._8_4_ * fVar56;
            auVar115._12_4_ = fVar134 * uStack_1200._4_4_ + auVar95._12_4_ * fVar57;
            local_1178._0_4_ = auVar94._0_4_;
            local_1178._4_4_ = auVar94._4_4_;
            fStack_1170 = auVar94._8_4_;
            fStack_116c = auVar94._12_4_;
            auVar123._0_4_ = fVar106 * (float)local_1178._0_4_ + auVar73._0_4_ * fVar46;
            auVar123._4_4_ = fVar132 * (float)local_1178._4_4_ + auVar73._4_4_ * fVar55;
            auVar123._8_4_ = fVar133 * fStack_1170 + auVar73._8_4_ * fVar56;
            auVar123._12_4_ = fVar134 * fStack_116c + auVar73._12_4_ * fVar57;
            local_11f8._0_4_ = auVar90._0_4_;
            local_11f8._4_4_ = auVar90._4_4_;
            fStack_11f0 = auVar90._8_4_;
            fStack_11ec = auVar90._12_4_;
            auVar125._0_4_ = auVar91._0_4_ * fVar46 + fVar106 * (float)local_11f8._0_4_;
            auVar125._4_4_ = auVar91._4_4_ * fVar55 + fVar132 * (float)local_11f8._4_4_;
            auVar125._8_4_ = auVar91._8_4_ * fVar56 + fVar133 * fStack_11f0;
            auVar125._12_4_ = auVar91._12_4_ * fVar57 + fVar134 * fStack_11ec;
            local_11e8._0_4_ = auVar85._0_4_;
            local_11e8._4_4_ = auVar85._4_4_;
            fStack_11e0 = auVar85._8_4_;
            fStack_11dc = auVar85._12_4_;
            auVar47._0_4_ = fVar106 * (float)local_11e8._0_4_ + auVar60._0_4_ * fVar46;
            auVar47._4_4_ = fVar132 * (float)local_11e8._4_4_ + auVar60._4_4_ * fVar55;
            auVar47._8_4_ = fVar133 * fStack_11e0 + auVar60._8_4_ * fVar56;
            auVar47._12_4_ = fVar134 * fStack_11dc + auVar60._12_4_ * fVar57;
            local_10e8 = *puVar2;
            uStack_10e0 = puVar2[1];
            auVar59 = vsubps_avx(auVar127,auVar61);
            auVar71 = vsubps_avx(_local_1188,auVar74);
            auVar58 = vsubps_avx(auVar104,auVar115);
            auVar90 = vsubps_avx(auVar123,auVar127);
            auVar69 = vsubps_avx(auVar125,_local_1188);
            auVar70 = vsubps_avx(auVar47,auVar104);
            fVar57 = auVar70._0_4_;
            fVar108 = auVar71._0_4_;
            auVar48._0_4_ = fVar108 * fVar57;
            fVar9 = auVar70._4_4_;
            fVar110 = auVar71._4_4_;
            auVar48._4_4_ = fVar110 * fVar9;
            fVar14 = auVar70._8_4_;
            fVar111 = auVar71._8_4_;
            auVar48._8_4_ = fVar111 * fVar14;
            fVar19 = auVar70._12_4_;
            fVar112 = auVar71._12_4_;
            auVar48._12_4_ = fVar112 * fVar19;
            fVar106 = auVar69._0_4_;
            fVar113 = auVar58._0_4_;
            auVar62._0_4_ = fVar113 * fVar106;
            fVar10 = auVar69._4_4_;
            fVar117 = auVar58._4_4_;
            auVar62._4_4_ = fVar117 * fVar10;
            fVar15 = auVar69._8_4_;
            fVar119 = auVar58._8_4_;
            auVar62._8_4_ = fVar119 * fVar15;
            fVar20 = auVar69._12_4_;
            fVar121 = auVar58._12_4_;
            auVar62._12_4_ = fVar121 * fVar20;
            local_1048 = vsubps_avx(auVar62,auVar48);
            fVar132 = auVar90._0_4_;
            auVar63._0_4_ = fVar113 * fVar132;
            fVar11 = auVar90._4_4_;
            auVar63._4_4_ = fVar117 * fVar11;
            fVar16 = auVar90._8_4_;
            auVar63._8_4_ = fVar119 * fVar16;
            fVar21 = auVar90._12_4_;
            auVar63._12_4_ = fVar121 * fVar21;
            fVar133 = auVar59._0_4_;
            auVar75._0_4_ = fVar57 * fVar133;
            fVar12 = auVar59._4_4_;
            auVar75._4_4_ = fVar9 * fVar12;
            fVar17 = auVar59._8_4_;
            auVar75._8_4_ = fVar14 * fVar17;
            fVar22 = auVar59._12_4_;
            auVar75._12_4_ = fVar19 * fVar22;
            local_1038 = vsubps_avx(auVar75,auVar63);
            auVar76._0_4_ = fVar106 * fVar133;
            auVar76._4_4_ = fVar10 * fVar12;
            auVar76._8_4_ = fVar15 * fVar17;
            auVar76._12_4_ = fVar20 * fVar22;
            auVar89._0_4_ = fVar108 * fVar132;
            auVar89._4_4_ = fVar110 * fVar11;
            auVar89._8_4_ = fVar111 * fVar16;
            auVar89._12_4_ = fVar112 * fVar21;
            _local_1208 = vsubps_avx(auVar89,auVar76);
            uVar36 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
            auVar49._4_4_ = uVar36;
            auVar49._0_4_ = uVar36;
            auVar49._8_4_ = uVar36;
            auVar49._12_4_ = uVar36;
            uVar36 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
            auVar129._4_4_ = uVar36;
            auVar129._0_4_ = uVar36;
            auVar129._8_4_ = uVar36;
            auVar129._12_4_ = uVar36;
            uVar36 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
            auVar135._4_4_ = uVar36;
            auVar135._0_4_ = uVar36;
            auVar135._8_4_ = uVar36;
            auVar135._12_4_ = uVar36;
            fVar46 = (ray->super_RayK<1>).dir.field_0.m128[1];
            _local_11e8 = vsubps_avx(auVar127,auVar49);
            fVar55 = (ray->super_RayK<1>).dir.field_0.m128[2];
            _local_11f8 = vsubps_avx(_local_1188,auVar129);
            _local_1178 = vsubps_avx(auVar104,auVar135);
            fVar134 = local_1178._0_4_;
            auVar105._0_4_ = fVar46 * fVar134;
            fVar13 = local_1178._4_4_;
            auVar105._4_4_ = fVar46 * fVar13;
            fVar18 = local_1178._8_4_;
            auVar105._8_4_ = fVar46 * fVar18;
            fVar23 = local_1178._12_4_;
            auVar105._12_4_ = fVar46 * fVar23;
            fVar97 = local_11f8._0_4_;
            auVar130._0_4_ = fVar97 * fVar55;
            fVar101 = local_11f8._4_4_;
            auVar130._4_4_ = fVar101 * fVar55;
            fVar102 = local_11f8._8_4_;
            auVar130._8_4_ = fVar102 * fVar55;
            fVar103 = local_11f8._12_4_;
            auVar130._12_4_ = fVar103 * fVar55;
            auVar71 = vsubps_avx(auVar130,auVar105);
            fVar56 = (ray->super_RayK<1>).dir.field_0.m128[0];
            fVar68 = local_11e8._0_4_;
            auVar136._0_4_ = fVar68 * fVar55;
            fVar81 = local_11e8._4_4_;
            auVar136._4_4_ = fVar81 * fVar55;
            fVar82 = local_11e8._8_4_;
            auVar136._8_4_ = fVar82 * fVar55;
            fVar83 = local_11e8._12_4_;
            auVar136._12_4_ = fVar83 * fVar55;
            auVar64._0_4_ = fVar56 * fVar134;
            auVar64._4_4_ = fVar56 * fVar13;
            auVar64._8_4_ = fVar56 * fVar18;
            auVar64._12_4_ = fVar56 * fVar23;
            auVar58 = vsubps_avx(auVar64,auVar136);
            auVar137._0_4_ = fVar56 * fVar97;
            auVar137._4_4_ = fVar56 * fVar101;
            auVar137._8_4_ = fVar56 * fVar102;
            auVar137._12_4_ = fVar56 * fVar103;
            auVar77._0_4_ = fVar46 * fVar68;
            auVar77._4_4_ = fVar46 * fVar81;
            auVar77._8_4_ = fVar46 * fVar82;
            auVar77._12_4_ = fVar46 * fVar83;
            auVar90 = vsubps_avx(auVar77,auVar137);
            auVar69 = _local_1208;
            auVar50._0_4_ =
                 local_1048._0_4_ * fVar56 + fVar46 * local_1038._0_4_ + local_1208._0_4_ * fVar55;
            auVar50._4_4_ =
                 local_1048._4_4_ * fVar56 + fVar46 * local_1038._4_4_ + local_1208._4_4_ * fVar55;
            auVar50._8_4_ =
                 local_1048._8_4_ * fVar56 + fVar46 * local_1038._8_4_ + local_1208._8_4_ * fVar55;
            auVar50._12_4_ =
                 local_1048._12_4_ * fVar56 +
                 fVar46 * local_1038._12_4_ + local_1208._12_4_ * fVar55;
            auVar78._8_8_ = 0x8000000080000000;
            auVar78._0_8_ = 0x8000000080000000;
            auVar59 = vandps_avx(auVar50,auVar78);
            uVar114 = auVar59._0_4_;
            local_10d8._0_4_ =
                 (float)(uVar114 ^
                        (uint)(fVar132 * auVar71._0_4_ +
                              fVar106 * auVar58._0_4_ + fVar57 * auVar90._0_4_));
            uVar118 = auVar59._4_4_;
            local_10d8._4_4_ =
                 (float)(uVar118 ^
                        (uint)(fVar11 * auVar71._4_4_ +
                              fVar10 * auVar58._4_4_ + fVar9 * auVar90._4_4_));
            uVar120 = auVar59._8_4_;
            local_10d8._8_4_ =
                 (float)(uVar120 ^
                        (uint)(fVar16 * auVar71._8_4_ +
                              fVar15 * auVar58._8_4_ + fVar14 * auVar90._8_4_));
            uVar122 = auVar59._12_4_;
            local_10d8._12_4_ =
                 (float)(uVar122 ^
                        (uint)(fVar21 * auVar71._12_4_ +
                              fVar20 * auVar58._12_4_ + fVar19 * auVar90._12_4_));
            local_10c8._0_4_ =
                 (float)(uVar114 ^
                        (uint)(fVar133 * auVar71._0_4_ +
                              fVar108 * auVar58._0_4_ + fVar113 * auVar90._0_4_));
            local_10c8._4_4_ =
                 (float)(uVar118 ^
                        (uint)(fVar12 * auVar71._4_4_ +
                              fVar110 * auVar58._4_4_ + fVar117 * auVar90._4_4_));
            local_10c8._8_4_ =
                 (float)(uVar120 ^
                        (uint)(fVar17 * auVar71._8_4_ +
                              fVar111 * auVar58._8_4_ + fVar119 * auVar90._8_4_));
            local_10c8._12_4_ =
                 (float)(uVar122 ^
                        (uint)(fVar22 * auVar71._12_4_ +
                              fVar112 * auVar58._12_4_ + fVar121 * auVar90._12_4_));
            auVar58 = ZEXT416(0) << 0x20;
            auVar59 = vcmpps_avx(local_10d8,auVar58,5);
            auVar71 = vcmpps_avx(local_10c8,auVar58,5);
            auVar59 = vandps_avx(auVar59,auVar71);
            auVar79._8_4_ = 0x7fffffff;
            auVar79._0_8_ = 0x7fffffff7fffffff;
            auVar79._12_4_ = 0x7fffffff;
            local_10a8 = vandps_avx(auVar50,auVar79);
            auVar71 = vcmpps_avx(auVar58,auVar50,4);
            auVar59 = vandps_avx(auVar59,auVar71);
            auVar65._0_4_ = local_10d8._0_4_ + local_10c8._0_4_;
            auVar65._4_4_ = local_10d8._4_4_ + local_10c8._4_4_;
            auVar65._8_4_ = local_10d8._8_4_ + local_10c8._8_4_;
            auVar65._12_4_ = local_10d8._12_4_ + local_10c8._12_4_;
            auVar71 = vcmpps_avx(auVar65,local_10a8,2);
            auVar59 = vandps_avx(auVar59,auVar71);
            auVar24._8_8_ = uStack_10f0;
            auVar24._0_8_ = local_10f8;
            auVar24 = auVar24 & auVar59;
            if ((((auVar24 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar24 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar24 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar24[0xf] < '\0') {
              auVar25._8_8_ = uStack_10f0;
              auVar25._0_8_ = local_10f8;
              auVar59 = vandps_avx(auVar59,auVar25);
              local_10b8._0_4_ =
                   (float)(uVar114 ^
                          (uint)(local_1048._0_4_ * fVar68 +
                                local_1038._0_4_ * fVar97 + fVar134 * local_1208._0_4_));
              local_10b8._4_4_ =
                   (float)(uVar118 ^
                          (uint)(local_1048._4_4_ * fVar81 +
                                local_1038._4_4_ * fVar101 + fVar13 * local_1208._4_4_));
              local_10b8._8_4_ =
                   (float)(uVar120 ^
                          (uint)(local_1048._8_4_ * fVar82 +
                                local_1038._8_4_ * fVar102 + fVar18 * local_1208._8_4_));
              local_10b8._12_4_ =
                   (float)(uVar122 ^
                          (uint)(local_1048._12_4_ * fVar83 +
                                local_1038._12_4_ * fVar103 + fVar23 * local_1208._12_4_));
              fVar46 = (ray->super_RayK<1>).org.field_0.m128[3];
              fVar55 = local_10a8._0_4_;
              auVar51._0_4_ = fVar55 * fVar46;
              fVar56 = local_10a8._4_4_;
              auVar51._4_4_ = fVar56 * fVar46;
              fVar57 = local_10a8._8_4_;
              auVar51._8_4_ = fVar57 * fVar46;
              fVar106 = local_10a8._12_4_;
              auVar51._12_4_ = fVar106 * fVar46;
              auVar71 = vcmpps_avx(auVar51,local_10b8,1);
              fVar46 = (ray->super_RayK<1>).tfar;
              auVar66._0_4_ = fVar55 * fVar46;
              auVar66._4_4_ = fVar56 * fVar46;
              auVar66._8_4_ = fVar57 * fVar46;
              auVar66._12_4_ = fVar106 * fVar46;
              auVar58 = vcmpps_avx(local_10b8,auVar66,2);
              auVar71 = vandps_avx(auVar58,auVar71);
              auVar58 = auVar59 & auVar71;
              if ((((auVar58 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar58 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar58 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar58[0xf] < '\0') {
                auVar59 = vandps_avx(auVar59,auVar71);
                local_1088 = auVar59;
                local_1028 = local_1208;
                uStack_1020 = uStack_1200;
                auVar71 = vrcpps_avx(local_10a8);
                fVar46 = auVar71._0_4_;
                auVar67._0_4_ = fVar55 * fVar46;
                fVar55 = auVar71._4_4_;
                auVar67._4_4_ = fVar56 * fVar55;
                fVar56 = auVar71._8_4_;
                auVar67._8_4_ = fVar57 * fVar56;
                fVar57 = auVar71._12_4_;
                auVar67._12_4_ = fVar106 * fVar57;
                auVar80._8_4_ = 0x3f800000;
                auVar80._0_8_ = &DAT_3f8000003f800000;
                auVar80._12_4_ = 0x3f800000;
                auVar71 = vsubps_avx(auVar80,auVar67);
                fVar46 = fVar46 + fVar46 * auVar71._0_4_;
                fVar55 = fVar55 + fVar55 * auVar71._4_4_;
                fVar56 = fVar56 + fVar56 * auVar71._8_4_;
                fVar57 = fVar57 + fVar57 * auVar71._12_4_;
                auVar96._0_4_ = fVar46 * local_10b8._0_4_;
                auVar96._4_4_ = fVar55 * local_10b8._4_4_;
                auVar96._8_4_ = fVar56 * local_10b8._8_4_;
                auVar96._12_4_ = fVar57 * local_10b8._12_4_;
                local_11d8 = auVar59;
                local_1058 = auVar96;
                local_1078[0] = fVar46 * local_10d8._0_4_;
                local_1078[1] = fVar55 * local_10d8._4_4_;
                local_1078[2] = fVar56 * local_10d8._8_4_;
                local_1078[3] = fVar57 * local_10d8._12_4_;
                local_1068[0] = fVar46 * local_10c8._0_4_;
                local_1068[1] = fVar55 * local_10c8._4_4_;
                local_1068[2] = fVar56 * local_10c8._8_4_;
                local_1068[3] = fVar57 * local_10c8._12_4_;
                auVar52._8_4_ = 0x7f800000;
                auVar52._0_8_ = 0x7f8000007f800000;
                auVar52._12_4_ = 0x7f800000;
                auVar71 = vblendvps_avx(auVar52,auVar96,auVar59);
                auVar58 = vshufps_avx(auVar71,auVar71,0xb1);
                auVar58 = vminps_avx(auVar58,auVar71);
                auVar90 = vshufpd_avx(auVar58,auVar58,1);
                auVar58 = vminps_avx(auVar90,auVar58);
                auVar71 = vcmpps_avx(auVar71,auVar58,0);
                auVar58 = auVar59 & auVar71;
                if ((((auVar58 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar58 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar58 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar58[0xf] < '\0') {
                  auVar59 = vandps_avx(auVar71,auVar59);
                }
                uVar36 = vmovmskps_avx(auVar59);
                uVar31 = CONCAT44((int)((ulong)lVar30 >> 0x20),uVar36);
                piVar42 = (int *)0x0;
                _local_1208 = auVar69;
                _local_fa8 = auVar88;
                _local_f98 = auVar100;
                if (uVar31 != 0) {
                  for (; (uVar31 >> (long)piVar42 & 1) == 0; piVar42 = (int *)((long)piVar42 + 1)) {
                  }
                }
                do {
                  uVar114 = *(uint *)((long)&local_f88 + (long)piVar42 * 4);
                  pGVar5 = (local_11c0->geometries).items[uVar114].ptr;
                  if ((pGVar5->mask & (ray->super_RayK<1>).mask) == 0) {
                    *(undefined4 *)(local_11d8 + (long)piVar42 * 4) = 0;
                  }
                  else {
                    pRVar7 = context->args;
                    if ((pRVar7->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      fVar46 = local_1078[(long)piVar42];
                      fVar55 = local_1068[(long)piVar42];
                      (ray->super_RayK<1>).tfar = *(float *)(local_1058 + (long)piVar42 * 4);
                      (ray->Ng).field_0.field_0.x = *(float *)(local_1048 + (long)piVar42 * 4);
                      (ray->Ng).field_0.field_0.y = *(float *)(local_1038 + (long)piVar42 * 4);
                      (ray->Ng).field_0.field_0.z =
                           *(float *)((long)&local_1028 + (long)piVar42 * 4);
                      ray->u = fVar46;
                      ray->v = fVar55;
                      ray->primID = *(uint *)((long)&local_10e8 + (long)piVar42 * 4);
                      ray->geomID = uVar114;
                      pRVar8 = context->user;
                      ray->instID[0] = pRVar8->instID[0];
                      ray->instPrimID[0] = pRVar8->instPrimID[0];
                      break;
                    }
                    local_11b8.context = context->user;
                    local_1128 = *(float *)(local_1048 + (long)piVar42 * 4);
                    local_1124 = *(undefined4 *)(local_1038 + (long)piVar42 * 4);
                    local_1120 = *(undefined4 *)((long)&local_1028 + (long)piVar42 * 4);
                    local_111c = local_1078[(long)piVar42];
                    local_1118 = local_1068[(long)piVar42];
                    local_1114 = *(undefined4 *)((long)&local_10e8 + (long)piVar42 * 4);
                    local_1110 = uVar114;
                    local_110c = (local_11b8.context)->instID[0];
                    local_1108 = (local_11b8.context)->instPrimID[0];
                    local_1208._0_4_ = (ray->super_RayK<1>).tfar;
                    (ray->super_RayK<1>).tfar = *(float *)(local_1058 + (long)piVar42 * 4);
                    local_120c = -1;
                    local_11b8.valid = &local_120c;
                    local_11b8.geometryUserPtr = pGVar5->userPtr;
                    local_11b8.ray = (RTCRayN *)ray;
                    local_11b8.hit = (RTCHitN *)&local_1128;
                    local_11b8.N = 1;
                    if ((pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
                       ((*pGVar5->intersectionFilterN)(&local_11b8), *local_11b8.valid != 0)) {
                      if (pRVar7->filter != (RTCFilterFunctionN)0x0) {
                        if (((pRVar7->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                           (((pGVar5->field_8).field_0x2 & 0x40) != 0)) {
                          (*pRVar7->filter)(&local_11b8);
                        }
                        if (*local_11b8.valid == 0) goto LAB_012b3198;
                      }
                      (((Vec3f *)((long)local_11b8.ray + 0x30))->field_0).field_0.x =
                           *(float *)local_11b8.hit;
                      (((Vec3f *)((long)local_11b8.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_11b8.hit + 4);
                      (((Vec3f *)((long)local_11b8.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_11b8.hit + 8);
                      *(float *)((long)local_11b8.ray + 0x3c) = *(float *)(local_11b8.hit + 0xc);
                      *(float *)((long)local_11b8.ray + 0x40) = *(float *)(local_11b8.hit + 0x10);
                      *(float *)((long)local_11b8.ray + 0x44) = *(float *)(local_11b8.hit + 0x14);
                      *(float *)((long)local_11b8.ray + 0x48) = *(float *)(local_11b8.hit + 0x18);
                      *(float *)((long)local_11b8.ray + 0x4c) = *(float *)(local_11b8.hit + 0x1c);
                      *(float *)((long)local_11b8.ray + 0x50) = *(float *)(local_11b8.hit + 0x20);
                    }
                    else {
LAB_012b3198:
                      (ray->super_RayK<1>).tfar = (float)local_1208._0_4_;
                    }
                    *(undefined4 *)(local_11d8 + (long)piVar42 * 4) = 0;
                    fVar46 = (ray->super_RayK<1>).tfar;
                    auVar53._4_4_ = fVar46;
                    auVar53._0_4_ = fVar46;
                    auVar53._8_4_ = fVar46;
                    auVar53._12_4_ = fVar46;
                    auVar59 = vcmpps_avx(auVar96,auVar53,2);
                    local_11d8 = vandps_avx(auVar59,local_11d8);
                  }
                  if ((((local_11d8 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                       (local_11d8 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (local_11d8 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      -1 < local_11d8[0xf]) break;
                  BVHNIntersector1<4,16777232,false,embree::avx::ArrayIntersector1<embree::avx::TriangleMiMBIntersector1Moeller<4,true>>>
                  ::intersect(&local_11b8);
                  piVar42 = local_11b8.valid;
                } while( true );
              }
            }
            lVar30 = lVar30 + 1;
          } while (lVar30 != local_1138);
        }
        fVar46 = (ray->super_RayK<1>).tfar;
        auVar54 = ZEXT1664(CONCAT412(fVar46,CONCAT48(fVar46,CONCAT44(fVar46,fVar46))));
        auVar107 = ZEXT1664(local_fb8);
        auVar109 = ZEXT1664(local_fc8);
        auVar116 = ZEXT1664(local_fd8);
        auVar124 = ZEXT1664(local_fe8);
        auVar126 = ZEXT1664(local_ff8);
        auVar128 = ZEXT1664(local_1008);
        auVar131 = ZEXT1664(local_1018);
        uVar31 = local_1148;
        uVar34 = local_1160;
        uVar35 = local_1168;
        uVar37 = local_1150;
        uVar39 = local_1158;
      } while( true );
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }